

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::DiscardEverythingFallback
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint *puVar1;
  char *pcVar2;
  uint tag;
  
  if ((ulong)table->has_bits_offset != 0) {
    puVar1 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar1 = *puVar1 | (uint)hasbits;
  }
  tag = data.field_0._0_4_;
  if (tag == 0 || (tag & 7) == 4) {
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
    return ptr;
  }
  pcVar2 = UnknownFieldParse(tag,(string *)0x0,ptr,ctx);
  return pcVar2;
}

Assistant:

const char* TcParser::DiscardEverythingFallback(PROTOBUF_TC_PARAM_DECL) {
  SyncHasbits(msg, hasbits, table);
  uint32_t tag = data.tag();
  if ((tag & 7) == WireFormatLite::WIRETYPE_END_GROUP || tag == 0) {
    ctx->SetLastTag(tag);
    return ptr;
  }
  return UnknownFieldParse(tag, nullptr, ptr, ctx);
}